

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O1

void __thiscall
cmDebugger::cmDebuggerExceptionManager::cmDebuggerExceptionManager
          (cmDebuggerExceptionManager *this,Session *dapSession)

{
  Session *pSVar1;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  TypeInfo *pTVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  key_type local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  long *local_68 [2];
  long local_58 [3];
  _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_40;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_38;
  
  this->DapSession = dapSession;
  (this->Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_38 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->RaiseExceptions;
  (this->RaiseExceptions)._M_h._M_buckets = &(this->RaiseExceptions)._M_h._M_single_bucket;
  (this->RaiseExceptions)._M_h._M_bucket_count = 1;
  (this->RaiseExceptions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->RaiseExceptions)._M_h._M_element_count = 0;
  (this->RaiseExceptions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->RaiseExceptions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->RaiseExceptions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_40 = (_Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->ExceptionMap;
  (this->ExceptionMap)._M_h._M_buckets = &(this->ExceptionMap)._M_h._M_single_bucket;
  (this->ExceptionMap)._M_h._M_bucket_count = 1;
  (this->ExceptionMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ExceptionMap)._M_h._M_element_count = 0;
  (this->ExceptionMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ExceptionMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ExceptionMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->TheException).super__Optional_base<cmDebugger::cmDebuggerException,_false,_false>.
  _M_payload.super__Optional_payload<cmDebugger::cmDebuggerException,_true,_false,_false>.
  super__Optional_payload_base<cmDebugger::cmDebuggerException>._M_engaged = false;
  pTVar2 = dap::TypeOf<dap::SetExceptionBreakpointsRequest>::type();
  local_88._8_8_ = 0;
  local_78._8_8_ =
       std::
       _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
       ::_M_invoke;
  local_78._0_8_ =
       std::
       _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
       ::_M_manager;
  local_88._0_8_ = this;
  (*dapSession->_vptr_Session[7])(dapSession,pTVar2);
  if ((code *)local_78._0_8_ != (code *)0x0) {
    (*(code *)local_78._0_8_)(local_88,local_88,3);
  }
  pSVar1 = this->DapSession;
  pTVar2 = dap::TypeOf<dap::ExceptionInfoRequest>::type();
  local_88._8_8_ = 0;
  local_78._8_8_ =
       std::
       _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
       ::_M_invoke;
  local_78._0_8_ =
       std::
       _Function_handler<void_(const_void_*,_const_std::function<void_(const_dap::TypeInfo_*,_const_void_*)>_&,_const_std::function<void_(const_dap::TypeInfo_*,_const_dap::Error_&)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:345:19)>
       ::_M_manager;
  local_88._0_8_ = this;
  (*pSVar1->_vptr_Session[7])(pSVar1,pTVar2);
  if ((code *)local_78._0_8_ != (code *)0x0) {
    (*(code *)local_78._0_8_)(local_88,local_88,3);
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"AUTHOR_WARNING","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Warning (dev)","");
  local_8c = AUTHOR_WARNING;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_40,&local_8c);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_88);
  std::__cxx11::string::operator=((string *)&pmVar3->Label,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"AUTHOR_ERROR","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Error (dev)","");
  local_8c = AUTHOR_ERROR;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_40,&local_8c);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_88);
  std::__cxx11::string::operator=((string *)&pmVar3->Label,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"FATAL_ERROR","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Fatal error","");
  local_8c = FATAL_ERROR;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_40,&local_8c);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_88);
  std::__cxx11::string::operator=((string *)&pmVar3->Label,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"INTERNAL_ERROR","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Internal error","");
  local_8c = INTERNAL_ERROR;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_40,&local_8c);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_88);
  std::__cxx11::string::operator=((string *)&pmVar3->Label,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"MESSAGE","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Other messages","");
  local_8c = MESSAGE;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_40,&local_8c);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_88);
  std::__cxx11::string::operator=((string *)&pmVar3->Label,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"WARNING","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Warning","");
  local_8c = WARNING;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_40,&local_8c);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_88);
  std::__cxx11::string::operator=((string *)&pmVar3->Label,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"LOG","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Debug log","");
  local_8c = LOG;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_40,&local_8c);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_88);
  std::__cxx11::string::operator=((string *)&pmVar3->Label,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"DEPRECATION_ERROR","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Deprecation error","");
  local_8c = DEPRECATION_ERROR;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_40,&local_8c);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_88);
  std::__cxx11::string::operator=((string *)&pmVar3->Label,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"DEPRECATION_WARNING","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Deprecation warning","");
  local_8c = DEPRECATION_WARNING;
  pmVar3 = std::__detail::
           _Map_base<MessageType,_std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>,_std::__detail::_Select1st,_std::equal_to<MessageType>,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_40,&local_8c);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)local_88);
  std::__cxx11::string::operator=((string *)&pmVar3->Label,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  this_00 = local_38;
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"AUTHOR_ERROR","");
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](this_00,(key_type *)local_88);
  *pmVar4 = true;
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"FATAL_ERROR","");
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](this_00,(key_type *)local_88);
  *pmVar4 = true;
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"INTERNAL_ERROR","");
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](this_00,(key_type *)local_88);
  *pmVar4 = true;
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"DEPRECATION_ERROR","");
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](this_00,(key_type *)local_88);
  *pmVar4 = true;
  if ((undefined1 *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
  }
  return;
}

Assistant:

cmDebuggerExceptionManager::cmDebuggerExceptionManager(
  dap::Session* dapSession)
  : DapSession(dapSession)
{
  // https://microsoft.github.io/debug-adapter-protocol/specification#Requests_SetExceptionBreakpoints
  DapSession->registerHandler(
    [&](const dap::SetExceptionBreakpointsRequest& request) {
      return HandleSetExceptionBreakpointsRequest(request);
    });

  // https://microsoft.github.io/debug-adapter-protocol/specification#Requests_ExceptionInfo
  DapSession->registerHandler([&](const dap::ExceptionInfoRequest& request) {
    (void)request;
    return HandleExceptionInfoRequest();
  });

  ExceptionMap[MessageType::AUTHOR_WARNING] =
    cmDebuggerExceptionFilter{ "AUTHOR_WARNING", "Warning (dev)" };
  ExceptionMap[MessageType::AUTHOR_ERROR] =
    cmDebuggerExceptionFilter{ "AUTHOR_ERROR", "Error (dev)" };
  ExceptionMap[MessageType::FATAL_ERROR] =
    cmDebuggerExceptionFilter{ "FATAL_ERROR", "Fatal error" };
  ExceptionMap[MessageType::INTERNAL_ERROR] =
    cmDebuggerExceptionFilter{ "INTERNAL_ERROR", "Internal error" };
  ExceptionMap[MessageType::MESSAGE] =
    cmDebuggerExceptionFilter{ "MESSAGE", "Other messages" };
  ExceptionMap[MessageType::WARNING] =
    cmDebuggerExceptionFilter{ "WARNING", "Warning" };
  ExceptionMap[MessageType::LOG] =
    cmDebuggerExceptionFilter{ "LOG", "Debug log" };
  ExceptionMap[MessageType::DEPRECATION_ERROR] =
    cmDebuggerExceptionFilter{ "DEPRECATION_ERROR", "Deprecation error" };
  ExceptionMap[MessageType::DEPRECATION_WARNING] =
    cmDebuggerExceptionFilter{ "DEPRECATION_WARNING", "Deprecation warning" };
  RaiseExceptions["AUTHOR_ERROR"] = true;
  RaiseExceptions["FATAL_ERROR"] = true;
  RaiseExceptions["INTERNAL_ERROR"] = true;
  RaiseExceptions["DEPRECATION_ERROR"] = true;
}